

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall GlobOpt::NewGenericValue(GlobOpt *this,ValueType valueType,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ValueInfo *valueInfo_00;
  Value *value;
  GlobOptBlockData *this_00;
  Value *val;
  ValueInfo *valueInfo;
  Opnd *opnd_local;
  GlobOpt *this_local;
  ValueType valueType_local;
  
  this_local._6_2_ = valueType.field_0;
  bVar2 = ValueType::IsLikelyInt((ValueType *)((long)&this_local + 6));
  if (((bVar2) && (opnd != (Opnd *)0x0)) && (bVar2 = IR::Opnd::IsNotInt(opnd), bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1068,"(!(valueType.IsLikelyInt() && opnd && opnd->IsNotInt()))",
                       "!(valueType.IsLikelyInt() && opnd && opnd->IsNotInt())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  valueInfo_00 = ValueInfo::New(this->alloc,(ValueType)this_local._6_2_);
  value = NewValue(this,valueInfo_00);
  TrackNewValueForKills(this,value);
  this_00 = CurrentBlockData(this);
  GlobOptBlockData::InsertNewValue(this_00,value,opnd);
  return value;
}

Assistant:

Value *
GlobOpt::NewGenericValue(const ValueType valueType, IR::Opnd *const opnd)
{
    // Shouldn't assign a likely-int value to something that is definitely not an int
    Assert(!(valueType.IsLikelyInt() && opnd && opnd->IsNotInt()));

    ValueInfo *valueInfo = ValueInfo::New(this->alloc, valueType);
    Value *val = NewValue(valueInfo);
    TrackNewValueForKills(val);

    CurrentBlockData()->InsertNewValue(val, opnd);
    return val;
}